

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeNotifier.cpp
# Opt level: O1

void __thiscall FileChangeNotifier::Update(FileChangeNotifier *this,float fDeltaTime)

{
  float fVar1;
  
  if (this->m_bActive == true) {
    FW::FileWatcher::update(this->m_pFileWatcher);
    fVar1 = this->m_fTimeUntilNextAllowedRecompile - fDeltaTime;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    this->m_fTimeUntilNextAllowedRecompile = fVar1;
    fVar1 = this->m_fFileChangeSpamTimeRemaining - fDeltaTime;
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    this->m_fFileChangeSpamTimeRemaining = fVar1;
    if (this->m_bRecompilePending == true) {
      TriggerNotificationIfPossible(this);
      return;
    }
  }
  return;
}

Assistant:

void FileChangeNotifier::Update( float fDeltaTime )
{
	if (m_bActive)
	{
        m_pFileWatcher->update();
		m_fTimeUntilNextAllowedRecompile = max(0.0f, m_fTimeUntilNextAllowedRecompile - fDeltaTime);
		m_fFileChangeSpamTimeRemaining = max(0.0f, m_fFileChangeSpamTimeRemaining - fDeltaTime);

		if (m_bRecompilePending)
		{
			TriggerNotificationIfPossible();
		}
	}
}